

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

Node<const_volatile_void_*,_const_void_*> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<void_const_volatile*,void_const*>>::
findNode<void_const_volatile*>
          (Data<QHashPrivate::Node<const_volatile_void_*,_const_void_*>_> *this,void **key)

{
  long lVar1;
  bool bVar2;
  Data<QHashPrivate::Node<const_volatile_void_*,_const_void_*>_> *in_RSI;
  long in_FS_OFFSET;
  Bucket bucket;
  void **in_stack_ffffffffffffffc8;
  undefined8 local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  findBucket<void_const_volatile*>(in_RSI,in_stack_ffffffffffffffc8);
  bVar2 = Data<QHashPrivate::Node<const_volatile_void_*,_const_void_*>_>::Bucket::isUnused
                    ((Bucket *)0x63360b);
  if (bVar2) {
    local_20 = (Node<const_volatile_void_*,_const_void_*> *)0x0;
  }
  else {
    local_20 = Data<QHashPrivate::Node<const_volatile_void_*,_const_void_*>_>::Bucket::node
                         ((Bucket *)0x633626);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_20;
  }
  __stack_chk_fail();
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }